

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvectornd.h
# Opt level: O0

QVector3D __thiscall QVector3D::normalized(QVector3D *this)

{
  bool bVar1;
  float *in_RDI;
  long in_FS_OFFSET;
  float fVar2;
  QVector3D QVar3;
  float len;
  float in_stack_ffffffffffffff9c;
  QVector3D local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar2 = length((QVector3D *)0x46069a);
  bVar1 = qFuzzyIsNull(in_stack_ffffffffffffff9c);
  if (bVar1) {
    local_14.v._0_8_ = *(undefined8 *)in_RDI;
    local_14.v[2] = in_RDI[2];
  }
  else {
    bVar1 = qFuzzyIsNull(in_stack_ffffffffffffff9c);
    if (bVar1) {
      QVector3D(&local_14);
    }
    else {
      QVector3D(&local_14,*in_RDI / fVar2,in_RDI[1] / fVar2,in_RDI[2] / fVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar3.v[2] = local_14.v[2];
  QVar3.v[0] = local_14.v[0];
  QVar3.v[1] = local_14.v[1];
  return (QVector3D)QVar3.v;
}

Assistant:

inline QVector3D QVector3D::normalized() const noexcept
{
    const float len = length();
    return qFuzzyIsNull(len - 1.0f) ? *this : qFuzzyIsNull(len) ? QVector3D()
        : QVector3D(v[0] / len, v[1] / len, v[2] / len);
}